

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

BinaryExpr<const_type_safe::basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type>_&,_const_type_safe::basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type>_&>
* __thiscall
Catch::
ExprLhs<type_safe::basic_variant<type_safe::optional_variant_policy,int,double,debugger_type>const&>
::operator<(BinaryExpr<const_type_safe::basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type>_&,_const_type_safe::basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type>_&>
            *__return_storage_ptr__,
           ExprLhs<type_safe::basic_variant<type_safe::optional_variant_policy,int,double,debugger_type>const&>
           *this,basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type> *rhs)

{
  basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type> *pbVar1;
  bool bVar2;
  StringRef local_38;
  
  bVar2 = type_safe::detail::
          compare_variant<type_safe::basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type>_>
          ::compare_less(*(basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type>
                           **)this,rhs);
  pbVar1 = *(basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type> **)this;
  StringRef::StringRef(&local_38,"<");
  (__return_storage_ptr__->super_ITransientExpression).m_isBinaryExpression = true;
  (__return_storage_ptr__->super_ITransientExpression).m_result = bVar2;
  (__return_storage_ptr__->super_ITransientExpression)._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_0021eb90;
  __return_storage_ptr__->m_lhs = pbVar1;
  (__return_storage_ptr__->m_op).m_start = local_38.m_start;
  (__return_storage_ptr__->m_op).m_size = local_38.m_size;
  __return_storage_ptr__->m_rhs = rhs;
  return __return_storage_ptr__;
}

Assistant:

auto operator < ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { static_cast<bool>(m_lhs < rhs), m_lhs, "<", rhs };
        }